

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O2

void __thiscall wasm::Fatal::~Fatal(Fatal *this)

{
  ostream *poVar1;
  undefined8 extraout_RAX;
  string local_28 [32];
  
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cerr,local_28);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_28);
  _Exit(1);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

[[noreturn]] ~Fatal() {
    std::cerr << buffer.str() << std::endl;
    // Use _Exit here to avoid calling static destructors. This avoids deadlocks
    // in (for example) the thread worker pool, where workers hold a lock while
    // performing their work.
    _Exit(EXIT_FAILURE);
  }